

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O0

void __thiscall
gpu::ConvolutionFilters<unsigned_char>::applyConvolution
          (ConvolutionFilters<unsigned_char> *this,uchar *inputBuffer,uchar *outputBuffer,
          int *kernel,int imageWidth,int imageHeight,int kernelSize,int normal,int offset,
          int channel)

{
  int c;
  int calc;
  int _offset;
  int count;
  int sum;
  int boundaryLimit;
  int boundaryBase;
  int startingOffset;
  int imageHeight_local;
  int imageWidth_local;
  int *kernel_local;
  uchar *outputBuffer_local;
  uchar *inputBuffer_local;
  ConvolutionFilters<unsigned_char> *this_local;
  
  sum = 0;
  count = 0;
  _offset = ((offset - imageWidth * (kernelSize / 2)) - kernelSize / 2) + -1;
  calc = 1;
  for (c = 1; c <= kernelSize * kernelSize; c = c + 1) {
    if (calc == kernelSize) {
      _offset = (imageWidth - kernelSize) + _offset;
      calc = 1;
    }
    else {
      _offset = _offset + 1;
    }
    if ((channel * imageWidth * imageHeight < _offset) &&
       (_offset < channel * imageWidth * imageHeight + imageWidth * imageHeight)) {
      sum = (uint)inputBuffer[_offset] * kernel[c + -1] + sum;
      count = kernel[c + -1] + count;
    }
    calc = calc + 1;
  }
  if (count == 0) {
    count = 1;
  }
  sum = sum / count;
  if (sum < 0x100) {
    if (sum < 0) {
      sum = 0;
    }
  }
  else {
    sum._0_1_ = 0xff;
  }
  outputBuffer[offset] = (uchar)sum;
  return;
}

Assistant:

FUNCTION_PREFIX void ConvolutionFilters<T>::applyConvolution(T* inputBuffer, 
                                                                 T* outputBuffer,
                                                                 int* kernel,
                                                                 int imageWidth,
                                                                 int imageHeight,
                                                                 int kernelSize,
                                                                 int normal,
                                                                 int offset,
                                                                 int channel)
    {
      int startingOffset=offset-(imageWidth*(kernelSize/2))-kernelSize/2;
      int boundaryBase  =channel*imageWidth*imageHeight;
      int boundaryLimit =channel*imageWidth*imageHeight+imageWidth*imageHeight;

      int sum=0;
      int count=0;
      int _offset=startingOffset-1;
      int calc=1;
      for (int c=1;c<=kernelSize*kernelSize;c++)
      {
        if(calc==kernelSize) {_offset+=(imageWidth-kernelSize); calc=1;}
        else _offset+=1;
        if (_offset>boundaryBase && _offset<boundaryLimit)
        {
          sum+=inputBuffer[_offset]*kernel[c-1];
          count+=kernel[c-1];
        }
        calc+=1;
      }
      if (count==0)count=1;
      sum=sum/count;
      PIXEL_DOMAIN_CHECK(sum);
      outputBuffer[offset]=sum;

    }